

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chachapoly.c
# Opt level: O3

int mbedtls_chachapoly_auth_decrypt
              (mbedtls_chachapoly_context *ctx,size_t length,uchar *nonce,uchar *aad,size_t aad_len,
              uchar *tag,uchar *input,uchar *output)

{
  undefined1 auVar1 [13];
  undefined1 auVar2 [13];
  undefined1 auVar3 [13];
  ulong uVar4;
  undefined1 auVar5 [13];
  int iVar6;
  long lVar7;
  uint uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  uchar check_tag [16];
  
  iVar6 = chachapoly_crypt_and_tag
                    (ctx,MBEDTLS_CHACHAPOLY_DECRYPT,length,nonce,aad,aad_len,input,output,check_tag)
  ;
  if (iVar6 == 0) {
    lVar7 = 0;
    auVar9 = (undefined1  [16])0x0;
    do {
      uVar8 = *(uint *)(check_tag + lVar7) ^ *(uint *)(tag + lVar7);
      uVar4 = (ulong)(ushort)uVar8 & 0xffffffffffff00ff;
      auVar1._8_4_ = 0;
      auVar1._0_8_ = uVar4;
      auVar1[0xc] = (char)(uVar8 >> 0x18);
      auVar2[8] = (char)(uVar8 >> 0x10);
      auVar2._0_8_ = uVar4;
      auVar2[9] = 0;
      auVar2._10_3_ = auVar1._10_3_;
      auVar5._5_8_ = 0;
      auVar5._0_5_ = auVar2._8_5_;
      auVar11._0_4_ = (undefined4)uVar4;
      auVar3[4] = (char)(uVar8 >> 8);
      auVar3._0_4_ = auVar11._0_4_;
      auVar3[5] = 0;
      auVar3._6_7_ = SUB137(auVar5 << 0x40,6);
      auVar11._4_9_ = auVar3._4_9_;
      auVar11._13_3_ = 0;
      auVar9 = auVar9 | auVar11;
      lVar7 = lVar7 + 4;
    } while (lVar7 != 0x10);
    auVar10._0_4_ = -(uint)(auVar9._0_4_ == 0);
    auVar10._4_4_ = -(uint)(auVar9._4_4_ == 0);
    auVar10._8_4_ = -(uint)(auVar9._8_4_ == 0);
    auVar10._12_4_ = -(uint)(auVar9._12_4_ == 0);
    iVar6 = movmskps(0x10,auVar10);
    if (iVar6 == 0xf) {
      iVar6 = 0;
    }
    else {
      mbedtls_platform_zeroize(output,length);
      iVar6 = -0x56;
    }
  }
  return iVar6;
}

Assistant:

int mbedtls_chachapoly_auth_decrypt( mbedtls_chachapoly_context *ctx,
                                     size_t length,
                                     const unsigned char nonce[12],
                                     const unsigned char *aad,
                                     size_t aad_len,
                                     const unsigned char tag[16],
                                     const unsigned char *input,
                                     unsigned char *output )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    unsigned char check_tag[16];
    size_t i;
    int diff;
    CHACHAPOLY_VALIDATE_RET( ctx   != NULL );
    CHACHAPOLY_VALIDATE_RET( nonce != NULL );
    CHACHAPOLY_VALIDATE_RET( tag   != NULL );
    CHACHAPOLY_VALIDATE_RET( aad_len == 0 || aad    != NULL );
    CHACHAPOLY_VALIDATE_RET( length  == 0 || input  != NULL );
    CHACHAPOLY_VALIDATE_RET( length  == 0 || output != NULL );

    if( ( ret = chachapoly_crypt_and_tag( ctx,
                        MBEDTLS_CHACHAPOLY_DECRYPT, length, nonce,
                        aad, aad_len, input, output, check_tag ) ) != 0 )
    {
        return( ret );
    }

    /* Check tag in "constant-time" */
    for( diff = 0, i = 0; i < sizeof( check_tag ); i++ )
        diff |= tag[i] ^ check_tag[i];

    if( diff != 0 )
    {
        mbedtls_platform_zeroize( output, length );
        return( MBEDTLS_ERR_CHACHAPOLY_AUTH_FAILED );
    }

    return( 0 );
}